

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall Clasp::Solver::ccMinRecurse(Solver *this,CCMinRecursive *ccMin,Literal p)

{
  uint uVar1;
  uint uVar2;
  undefined4 in_EAX;
  int iVar3;
  undefined8 uStack_18;
  
  uVar1 = *(uint *)((long)(this->epoch_).ebo_.buf + (ulong)(p.rep_ & 0xfffffffc));
  uVar2 = ccMin->open;
  if (uVar1 <= uVar2) {
    uStack_18 = CONCAT44(p.rep_,in_EAX) & 0xfffffffeffffffff;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              (&ccMin->todo,(Literal *)((long)&uStack_18 + 4));
  }
  iVar3 = uVar1 - uVar2;
  if (uVar1 < uVar2) {
    iVar3 = 0;
  }
  return iVar3 != 2;
}

Assistant:

void Solver::updateVars() {
	if (numVars() > shared_->numVars()) {
		popVars(numVars() - shared_->numVars(), false, 0);
	}
	else {
		assign_.resize(shared_->numVars() + 1);
		watches_.resize(assign_.numVars()<<1);
	}
}